

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O0

void __thiscall pmx::PmxModel::Init(PmxModel *this)

{
  PmxModel *this_local;
  
  this->version = 0.0;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  this->vertex_count = 0;
  std::unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_>::operator=
            (&this->vertices,(nullptr_t)0x0);
  this->index_count = 0;
  std::unique_ptr<int[],_std::default_delete<int[]>_>::operator=(&this->indices,(nullptr_t)0x0);
  this->texture_count = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
  ::operator=(&this->textures,(nullptr_t)0x0);
  this->material_count = 0;
  std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::operator=
            (&this->materials,(nullptr_t)0x0);
  this->bone_count = 0;
  std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::operator=
            (&this->bones,(nullptr_t)0x0);
  this->morph_count = 0;
  std::unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_>::operator=
            (&this->morphs,(nullptr_t)0x0);
  this->frame_count = 0;
  std::unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_>::operator=
            (&this->frames,(nullptr_t)0x0);
  this->rigid_body_count = 0;
  std::unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_>::operator=
            (&this->rigid_bodies,(nullptr_t)0x0);
  this->joint_count = 0;
  std::unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_>::operator=
            (&this->joints,(nullptr_t)0x0);
  this->soft_body_count = 0;
  std::unique_ptr<pmx::PmxSoftBody[],_std::default_delete<pmx::PmxSoftBody[]>_>::operator=
            (&this->soft_bodies,(nullptr_t)0x0);
  return;
}

Assistant:

void PmxModel::Init()
	{
		this->version = 0.0f;
		this->model_name.clear();
		this->model_english_name.clear();
		this->model_comment.clear();
		this->model_english_comment.clear();
		this->vertex_count = 0;
		this->vertices = nullptr;
		this->index_count = 0;
		this->indices = nullptr;
		this->texture_count = 0;
		this->textures = nullptr;
		this->material_count = 0;
		this->materials = nullptr;
		this->bone_count = 0;
		this->bones = nullptr;
		this->morph_count = 0;
		this->morphs = nullptr;
		this->frame_count = 0;
		this->frames = nullptr;
		this->rigid_body_count = 0;
		this->rigid_bodies = nullptr;
		this->joint_count = 0;
		this->joints = nullptr;
		this->soft_body_count = 0;
		this->soft_bodies = nullptr;
	}